

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<12,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Matrix<float,_4,_2> *extraout_RDX;
  Matrix<float,_4,_2> *extraout_RDX_00;
  Matrix<float,_4,_2> *mat;
  Matrix<float,_4,_2> *mat_00;
  Type in0;
  Matrix<float,_4,_2> local_c8;
  MatrixCaseUtils local_9c [12];
  MatrixCaseUtils local_90 [12];
  tcu local_84 [12];
  VecAccess<float,_4,_3> local_78;
  Matrix<float,_4,_2> local_60;
  Matrix<float,_4,_2> local_40;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    tcu::Matrix<float,_4,_2>::Matrix(&local_c8);
    local_c8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_c8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_c8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_c8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_4,_2>::Matrix(&local_c8,(float *)s_constInMat2x4);
    mat = extraout_RDX_00;
  }
  decrement<float,4,2>(&local_40,(MatrixCaseUtils *)&local_c8,mat);
  reduceToVec3(local_90,&local_40);
  decrement<float,4,2>(&local_60,(MatrixCaseUtils *)&local_c8,mat_00);
  reduceToVec3(local_9c,&local_60);
  tcu::operator+(local_84,(Vector<float,_3> *)local_90,(Vector<float,_3> *)local_9c);
  local_78.m_vector = &evalCtx->color;
  local_78.m_index[0] = 0;
  local_78.m_index[1] = 1;
  local_78.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,(Vector<float,_3> *)local_84);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}